

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O1

int arkAllocVectors(ARKodeMem ark_mem,N_Vector tmpl)

{
  int iVar1;
  
  iVar1 = arkAllocVec(ark_mem,tmpl,&ark_mem->ewt);
  if (iVar1 != 0) {
    if (ark_mem->rwt_is_ewt != 0) {
      ark_mem->rwt = ark_mem->ewt;
    }
    iVar1 = arkAllocVec(ark_mem,tmpl,&ark_mem->yn);
    if (iVar1 != 0) {
      iVar1 = arkAllocVec(ark_mem,tmpl,&ark_mem->tempv1);
      if (iVar1 != 0) {
        iVar1 = arkAllocVec(ark_mem,tmpl,&ark_mem->tempv2);
        if (iVar1 != 0) {
          iVar1 = arkAllocVec(ark_mem,tmpl,&ark_mem->tempv3);
          if (iVar1 != 0) {
            iVar1 = arkAllocVec(ark_mem,tmpl,&ark_mem->tempv4);
            return iVar1;
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

sunbooleantype arkAllocVectors(ARKodeMem ark_mem, N_Vector tmpl)
{
  /* Allocate ewt if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->ewt)) { return (SUNFALSE); }

  /* Set rwt to point at ewt */
  if (ark_mem->rwt_is_ewt) { ark_mem->rwt = ark_mem->ewt; }

  /* Allocate yn if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->yn)) { return (SUNFALSE); }

  /* Allocate tempv1 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv1)) { return (SUNFALSE); }

  /* Allocate tempv2 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv2)) { return (SUNFALSE); }

  /* Allocate tempv3 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv3)) { return (SUNFALSE); }

  /* Allocate tempv4 if needed */
  if (!arkAllocVec(ark_mem, tmpl, &ark_mem->tempv4)) { return (SUNFALSE); }

  return (SUNTRUE);
}